

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *p)

{
  Options *options;
  anon_unknown_0 *this_00;
  Printer *pPVar1;
  bool bVar2;
  value_type_conflict field;
  FieldGenerator *this_01;
  Options *in_RCX;
  long lVar3;
  undefined1 split;
  char *pcVar4;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  Span<const_google::protobuf::io::Printer::Sub> vars_02;
  Printer *p_local;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t_1;
  allocator<char> local_6ca;
  allocator<char> local_6c9;
  string local_6c8;
  Iterator __end3;
  Iterator __begin3;
  undefined1 *local_688;
  undefined8 local_680;
  undefined1 local_678 [8];
  undefined8 uStack_670;
  undefined1 *local_668;
  undefined8 local_660;
  undefined1 local_658 [8];
  undefined8 uStack_650;
  undefined1 *local_648;
  undefined8 local_640;
  undefined1 local_638 [8];
  undefined8 uStack_630;
  char *local_628;
  size_type local_620;
  char local_618 [8];
  undefined8 uStack_610;
  char *local_608;
  char local_600 [24];
  undefined1 *local_5e8;
  undefined8 local_5e0;
  undefined1 local_5d8 [8];
  undefined8 uStack_5d0;
  char *local_5c8;
  size_type local_5c0;
  char local_5b8 [8];
  undefined8 uStack_5b0;
  char *local_5a8;
  char local_5a0 [24];
  char *local_588;
  char local_580 [24];
  undefined1 *local_568;
  undefined8 local_560;
  undefined1 local_558 [8];
  undefined8 uStack_550;
  char *local_548;
  size_type local_540;
  char local_538 [8];
  undefined8 uStack_530;
  char *local_528;
  char local_520 [24];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v_1;
  variant<std::__cxx11::string,std::function<bool()>> local_4e8 [32];
  __index_type local_4c8;
  _Alloc_hider local_4c0;
  size_type local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  bool local_4a0;
  bool local_458;
  undefined1 local_450 [64];
  __index_type local_410;
  _Alloc_hider local_408;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  bool local_3e8;
  bool local_3a0;
  undefined1 *local_398;
  undefined8 local_390;
  undefined1 local_388 [8];
  undefined8 uStack_380;
  variant<std::__cxx11::string,std::function<bool()>> local_378 [32];
  char local_358;
  undefined1 *local_350;
  undefined8 local_348;
  undefined1 local_340 [16];
  undefined1 local_330;
  undefined1 local_2e8;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0 [8];
  undefined8 uStack_2c8;
  variant<std::__cxx11::string,std::function<bool()>> local_2c0 [32];
  char local_2a0;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288 [16];
  undefined1 local_278;
  undefined1 local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  variant<std::__cxx11::string,std::function<bool()>> local_208 [32];
  char local_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [16];
  undefined1 local_1c0;
  undefined1 local_178;
  string local_170;
  string local_150;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Options local_100;
  
  options = &this->options_;
  p_local = p;
  bVar2 = ShouldGenerateClass(this->descriptor_,options);
  if (bVar2) {
    this_00 = (anon_unknown_0 *)this->descriptor_;
    Options::Options(&local_100,options);
    anon_unknown_0::ClassVars
              ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                *)&v_1,this_00,(Descriptor *)&local_100,in_RCX);
    vars.len_ = (long)(v_1.storage_.callback_buffer_._0_8_ - v_1.storage_._0_8_) / 0xb8;
    vars.ptr_ = (pointer)v_1.storage_._0_8_;
    io::Printer::WithVars(&v,p,vars);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)&v_1);
    Options::~Options(&local_100);
    pPVar1 = p_local;
    MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)&v_1,this->descriptor_,options);
    vars_00.len_ = (long)(v_1.storage_.callback_buffer_._0_8_ - v_1.storage_._0_8_) / 0xb8;
    vars_00.ptr_ = (pointer)v_1.storage_._0_8_;
    io::Printer::WithVars(&t,pPVar1,vars_00);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
               *)&v_1);
    pPVar1 = p_local;
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) == '\x01') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"annotate_accessors",(allocator<char> *)&local_6c8);
      v_1.storage_._0_8_ = v_1.storage_.callback_buffer_ + 8;
      if (local_528 != local_520 + 8) {
        v_1.storage_._0_8_ = local_528;
      }
      v_1.storage_.callback_buffer_[0] = local_520[0];
      v_1.storage_.callback_buffer_[1] = local_520[1];
      v_1.storage_.callback_buffer_[2] = local_520[2];
      v_1.storage_.callback_buffer_[3] = local_520[3];
      v_1.storage_.callback_buffer_[4] = local_520[4];
      v_1.storage_.callback_buffer_[5] = local_520[5];
      v_1.storage_.callback_buffer_[6] = local_520[6];
      v_1.storage_.callback_buffer_[7] = local_520[7];
      local_520[0] = '\0';
      local_520[1] = '\0';
      local_520[2] = '\0';
      local_520[3] = '\0';
      local_520[4] = '\0';
      local_520[5] = '\0';
      local_520[6] = '\0';
      local_520[7] = '\0';
      local_520[8] = 0;
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_528 = local_520 + 8;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_4e8,(function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_4c0._M_p = (pointer)&local_4b0;
      local_4b8 = 0;
      local_4b0._M_local_buf[0] = '\0';
      local_4a0 = false;
      if (local_4c8 == '\x01') {
        std::__cxx11::string::assign((char *)&local_4c0);
      }
      local_458 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_548,"verify",(allocator<char> *)&__begin3);
      local_450._0_8_ = local_450 + 0x10;
      if (local_548 == local_538) {
        local_450._24_8_ = uStack_530;
      }
      else {
        local_450._0_8_ = local_548;
      }
      local_450._8_8_ = local_540;
      local_540 = 0;
      local_538[0] = '\0';
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_548 = local_538;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_450 + 0x20),
                 (function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_408._M_p = (pointer)&local_3f8;
      local_400 = 0;
      local_3f8._M_local_buf[0] = '\0';
      local_3e8 = false;
      if (local_410 == '\x01') {
        std::__cxx11::string::assign((char *)&local_408);
      }
      local_3a0 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,"class_data",(allocator<char> *)&__end3);
      local_398 = local_388;
      if (local_568 == local_558) {
        uStack_380 = uStack_550;
      }
      else {
        local_398 = local_568;
      }
      local_390 = local_560;
      local_560 = 0;
      local_558[0] = 0;
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_568 = local_558;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_378,(function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_350 = local_340;
      local_348 = 0;
      local_340[0] = 0;
      local_330 = 0;
      if (local_358 == '\x01') {
        std::__cxx11::string::assign((char *)&local_350);
      }
      local_2e8 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar1,&v_1,3,0x22d,
                 "\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n              $classname$::$classname$() : SuperType(_class_data_.base()) {}\n              $classname$::$classname$(::$proto_ns$::Arena* arena)\n                  : SuperType(arena, _class_data_.base()) {}\n#else   // PROTOBUF_CUSTOM_VTABLE\n              $classname$::$classname$() : SuperType() {}\n              $classname$::$classname$(::$proto_ns$::Arena* arena) : SuperType(arena) {}\n#endif  // PROTOBUF_CUSTOM_VTABLE\n              $annotate_accessors$;\n              $verify$;\n              $class_data$;\n            "
                );
      lVar3 = 0x170;
      do {
        io::Printer::Sub::~Sub((Sub *)(v_1.storage_.callback_buffer_ + lVar3 + -8));
        lVar3 = lVar3 + -0xb8;
      } while (lVar3 != -0xb8);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_528);
      ParseFunctionGenerator::GenerateDataDefinitions
                ((this->parse_function_generator_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                 ._M_head_impl,p_local);
    }
    else {
      bVar2 = IsAnyMessage(this->descriptor_);
      pPVar1 = p_local;
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_588,"any_field_descriptor",(allocator<char> *)&local_6c8);
        v_1.storage_._0_8_ = v_1.storage_.callback_buffer_ + 8;
        if (local_588 != local_580 + 8) {
          v_1.storage_._0_8_ = local_588;
        }
        v_1.storage_.callback_buffer_[0] = local_580[0];
        v_1.storage_.callback_buffer_[1] = local_580[1];
        v_1.storage_.callback_buffer_[2] = local_580[2];
        v_1.storage_.callback_buffer_[3] = local_580[3];
        v_1.storage_.callback_buffer_[4] = local_580[4];
        v_1.storage_.callback_buffer_[5] = local_580[5];
        v_1.storage_.callback_buffer_[6] = local_580[6];
        v_1.storage_.callback_buffer_[7] = local_580[7];
        local_580[0] = '\0';
        local_580[1] = '\0';
        local_580[2] = '\0';
        local_580[3] = '\0';
        local_580[4] = '\0';
        local_580[5] = '\0';
        local_580[6] = '\0';
        local_580[7] = '\0';
        local_580[8] = 0;
        t_1.storage_.callback_buffer_[8] = '\0';
        t_1.storage_.callback_buffer_[9] = '\0';
        t_1.storage_.callback_buffer_[10] = '\0';
        t_1.storage_.callback_buffer_[0xb] = '\0';
        t_1.storage_.callback_buffer_[0xc] = '\0';
        t_1.storage_.callback_buffer_[0xd] = '\0';
        t_1.storage_.callback_buffer_[0xe] = '\0';
        t_1.storage_.callback_buffer_[0xf] = '\0';
        t_1.storage_.is_callback_engaged_ = false;
        t_1.storage_._1_7_ = 0;
        t_1.storage_.callback_buffer_[0] = '\0';
        t_1.storage_.callback_buffer_[1] = '\0';
        t_1.storage_.callback_buffer_[2] = '\0';
        t_1.storage_.callback_buffer_[3] = '\0';
        t_1.storage_.callback_buffer_[4] = '\0';
        t_1.storage_.callback_buffer_[5] = '\0';
        t_1.storage_.callback_buffer_[6] = '\0';
        t_1.storage_.callback_buffer_[7] = '\0';
        local_588 = local_580 + 8;
        t_1.storage_._0_8_ = operator_new(0x18);
        *(MessageGenerator **)t_1.storage_._0_8_ = this;
        *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
        *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
        t_1.storage_.callback_buffer_._8_8_ =
             std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
        std::variant<std::__cxx11::string,std::function<bool()>>::
        variant<std::function<bool()>,void,void,std::function<bool()>,void>
                  (local_4e8,(function<bool_()> *)&t_1);
        std::_Function_base::~_Function_base((_Function_base *)&t_1);
        local_4c0._M_p = (pointer)&local_4b0;
        local_4b8 = 0;
        local_4b0._M_local_buf[0] = '\0';
        local_4a0 = false;
        if (local_4c8 == '\x01') {
          std::__cxx11::string::assign((char *)&local_4c0);
        }
        local_458 = false;
        google::protobuf::io::Printer::Emit
                  (pPVar1,&v_1,1,0x12a,
                   "\n              $any_field_descriptor$;\n              bool $classname$::ParseAnyTypeUrl(::absl::string_view type_url,\n                                                std::string* full_type_name) {\n                return ::_pbi::ParseAnyTypeUrl(type_url, full_type_name);\n              }\n            "
                  );
        io::Printer::Sub::~Sub((Sub *)&v_1);
        std::__cxx11::string::~string((string *)&local_588);
      }
      pPVar1 = p_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"has_bit",(allocator<char> *)&local_6c8);
      v_1.storage_._0_8_ = v_1.storage_.callback_buffer_ + 8;
      if (local_5a8 != local_5a0 + 8) {
        v_1.storage_._0_8_ = local_5a8;
      }
      v_1.storage_.callback_buffer_[0] = local_5a0[0];
      v_1.storage_.callback_buffer_[1] = local_5a0[1];
      v_1.storage_.callback_buffer_[2] = local_5a0[2];
      v_1.storage_.callback_buffer_[3] = local_5a0[3];
      v_1.storage_.callback_buffer_[4] = local_5a0[4];
      v_1.storage_.callback_buffer_[5] = local_5a0[5];
      v_1.storage_.callback_buffer_[6] = local_5a0[6];
      v_1.storage_.callback_buffer_[7] = local_5a0[7];
      local_5a0[0] = '\0';
      local_5a0[1] = '\0';
      local_5a0[2] = '\0';
      local_5a0[3] = '\0';
      local_5a0[4] = '\0';
      local_5a0[5] = '\0';
      local_5a0[6] = '\0';
      local_5a0[7] = '\0';
      local_5a0[8] = 0;
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_5a8 = local_5a0 + 8;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_4e8,(function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_4c0._M_p = (pointer)&local_4b0;
      local_4b8 = 0;
      local_4b0._M_local_buf[0] = '\0';
      local_4a0 = false;
      if (local_4c8 == '\x01') {
        std::__cxx11::string::assign((char *)&local_4c0);
      }
      local_458 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,"oneof",(allocator<char> *)&__begin3);
      local_450._0_8_ = local_450 + 0x10;
      if (local_5c8 == local_5b8) {
        local_450._24_8_ = uStack_5b0;
      }
      else {
        local_450._0_8_ = local_5c8;
      }
      local_450._8_8_ = local_5c0;
      local_5c0 = 0;
      local_5b8[0] = '\0';
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_5c8 = local_5b8;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_450 + 0x20),
                 (function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_408._M_p = (pointer)&local_3f8;
      local_400 = 0;
      local_3f8._M_local_buf[0] = '\0';
      local_3e8 = false;
      if (local_410 == '\x01') {
        std::__cxx11::string::assign((char *)&local_408);
      }
      local_3a0 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,"required",(allocator<char> *)&__end3);
      local_398 = local_388;
      if (local_5e8 == local_5d8) {
        uStack_380 = uStack_5d0;
      }
      else {
        local_398 = local_5e8;
      }
      local_390 = local_5e0;
      local_5e0 = 0;
      local_5d8[0] = 0;
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_5e8 = local_5d8;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_378,(function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_350 = local_340;
      local_348 = 0;
      local_340[0] = 0;
      local_330 = 0;
      if (local_358 == '\x01') {
        std::__cxx11::string::assign((char *)&local_350);
      }
      local_2e8 = 0;
      pcVar4 = 
      "\n        class $classname$::_Internal {\n         public:\n          $has_bit$;\n          $oneof$;\n          $required$;\n        };\n      "
      ;
      google::protobuf::io::Printer::Emit(pPVar1,&v_1,3,0x88);
      lVar3 = 0x170;
      do {
        io::Printer::Sub::~Sub((Sub *)(v_1.storage_.callback_buffer_ + lVar3 + -8));
        lVar3 = lVar3 + -0xb8;
      } while (lVar3 != -0xb8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5a8);
      io::Printer::Emit(p_local,1,"\n");
      __end3.descriptor = this->descriptor_;
      __begin3.idx = 0;
      __end3.idx = *(int *)(__end3.descriptor + 4);
      __begin3.descriptor = __end3.descriptor;
      while( true ) {
        bVar2 = protobuf::internal::operator!=(&__begin3,&__end3);
        split = SUB81(pcVar4,0);
        if (!bVar2) break;
        field = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::
                operator*(&__begin3);
        pPVar1 = p_local;
        FieldVars((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)&t_1,field,options);
        vars_01.len_ = (long)(t_1.storage_.callback_buffer_._0_8_ - t_1.storage_._0_8_) / 0xb8;
        vars_01.ptr_ = (pointer)t_1.storage_._0_8_;
        io::Printer::WithVars(&v_1,pPVar1,vars_01);
        std::
        vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)&t_1);
        pPVar1 = p_local;
        MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                          *)&local_6c8,field,options);
        vars_02.len_ = (long)(local_6c8._M_string_length - (long)local_6c8._M_dataplus._M_p) / 0xb8;
        vars_02.ptr_ = (pointer)local_6c8._M_dataplus._M_p;
        io::Printer::WithVars(&t_1,pPVar1,vars_02);
        std::
        vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
        ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                   *)&local_6c8);
        this_01 = FieldGeneratorTable::get(&this->field_generators_,field);
        FieldGenerator::GenerateNonInlineAccessorDefinitions(this_01,p_local);
        bVar2 = anon_unknown_0::IsCrossFileMaybeMap(field);
        if (bVar2) {
          GenerateFieldClear(this,field,false,p_local);
        }
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup(&t_1);
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup(&v_1);
        __begin3.idx = __begin3.idx + 1;
      }
      GenerateStructors(this,p_local);
      io::Printer::Emit(p_local,1,"\n");
      if (0 < *(int *)(this->descriptor_ + 0x7c)) {
        GenerateOneofClear(this,p_local);
        io::Printer::Emit(p_local,1,"\n");
      }
      GenerateClassData(this,p_local);
      ParseFunctionGenerator::GenerateDataDefinitions
                ((this->parse_function_generator_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>
                 ._M_head_impl,p_local);
      bVar2 = HasGeneratedMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),options);
      if (bVar2) {
        GenerateClear(this,p_local);
        io::Printer::Emit(p_local,1,"\n");
        GenerateSerializeWithCachedSizesToArray(this,p_local);
        io::Printer::Emit(p_local,1,"\n");
        GenerateByteSize(this,p_local);
        io::Printer::Emit(p_local,1,"\n");
        GenerateClassSpecificMergeImpl(this,p_local);
        io::Printer::Emit(p_local,1,"\n");
        GenerateCopyFrom(this,p_local);
        io::Printer::Emit(p_local,1,"\n");
        GenerateIsInitialized(this,p_local);
        io::Printer::Emit(p_local,1,"\n");
      }
      bVar2 = ShouldSplit(this->descriptor_,options);
      pPVar1 = p_local;
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"split_default",(allocator<char> *)&__begin3);
        DefaultInstanceName_abi_cxx11_
                  ((string *)&t_1,(cpp *)this->descriptor_,(Descriptor *)options,(Options *)0x1,
                   (bool)split);
        io::Printer::Sub::Sub<std::__cxx11::string>
                  ((Sub *)&v_1,&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"default",(allocator<char> *)&__end3);
        DefaultInstanceName_abi_cxx11_
                  (&local_6c8,(cpp *)this->descriptor_,(Descriptor *)options,(Options *)0x0,
                   (bool)split);
        io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_450,&local_170,&local_6c8);
        google::protobuf::io::Printer::Emit
                  (pPVar1,&v_1,2,0x1ae,
                   "\n              void $classname$::PrepareSplitMessageForWrite() {\n                if (PROTOBUF_PREDICT_TRUE(IsSplitMessageDefault())) {\n                  void* chunk = $pbi$::CreateSplitMessageGeneric(\n                      GetArena(), &$split_default$, sizeof(Impl_::Split), this,\n                      &$default$);\n                  $split$ = reinterpret_cast<Impl_::Split*>(chunk);\n                }\n              }\n            "
                  );
        lVar3 = 0xb8;
        do {
          io::Printer::Sub::~Sub((Sub *)(v_1.storage_.callback_buffer_ + lVar3 + -8));
          lVar3 = lVar3 + -0xb8;
        } while (lVar3 != -0xb8);
        std::__cxx11::string::~string((string *)&local_6c8);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&t_1);
        std::__cxx11::string::~string((string *)&local_150);
      }
      GenerateSwap(this,p_local);
      io::Printer::Emit(p_local,1,"\n");
      pPVar1 = p_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_608,"annotate_accessor_definition",(allocator<char> *)&local_6c8);
      v_1.storage_._0_8_ = v_1.storage_.callback_buffer_ + 8;
      if (local_608 != local_600 + 8) {
        v_1.storage_._0_8_ = local_608;
      }
      v_1.storage_.callback_buffer_[0] = local_600[0];
      v_1.storage_.callback_buffer_[1] = local_600[1];
      v_1.storage_.callback_buffer_[2] = local_600[2];
      v_1.storage_.callback_buffer_[3] = local_600[3];
      v_1.storage_.callback_buffer_[4] = local_600[4];
      v_1.storage_.callback_buffer_[5] = local_600[5];
      v_1.storage_.callback_buffer_[6] = local_600[6];
      v_1.storage_.callback_buffer_[7] = local_600[7];
      local_600[0] = '\0';
      local_600[1] = '\0';
      local_600[2] = '\0';
      local_600[3] = '\0';
      local_600[4] = '\0';
      local_600[5] = '\0';
      local_600[6] = '\0';
      local_600[7] = '\0';
      local_600[8] = 0;
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_608 = local_600 + 8;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_4e8,(function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_4c0._M_p = (pointer)&local_4b0;
      local_4b8 = 0;
      local_4b0._M_local_buf[0] = '\0';
      local_4a0 = false;
      if (local_4c8 == '\x01') {
        std::__cxx11::string::assign((char *)&local_4c0);
      }
      local_458 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_628,"get_metadata",(allocator<char> *)&__begin3);
      local_450._0_8_ = local_450 + 0x10;
      if (local_628 == local_618) {
        local_450._24_8_ = uStack_610;
      }
      else {
        local_450._0_8_ = local_628;
      }
      local_450._8_8_ = local_620;
      local_620 = 0;
      local_618[0] = '\0';
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_628 = local_618;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_450 + 0x20),
                 (function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_408._M_p = (pointer)&local_3f8;
      local_400 = 0;
      local_3f8._M_local_buf[0] = '\0';
      local_3e8 = false;
      if (local_410 == '\x01') {
        std::__cxx11::string::assign((char *)&local_408);
      }
      local_3a0 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_648,"post_loop_handler",(allocator<char> *)&__end3);
      local_398 = local_388;
      if (local_648 == local_638) {
        uStack_380 = uStack_630;
      }
      else {
        local_398 = local_648;
      }
      local_390 = local_640;
      local_640 = 0;
      local_638[0] = 0;
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_648 = local_638;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_378,(function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_350 = local_340;
      local_348 = 0;
      local_340[0] = 0;
      local_330 = 0;
      if (local_358 == '\x01') {
        std::__cxx11::string::assign((char *)&local_350);
      }
      local_2e8 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,"message_set_definition",&local_6c9);
      local_2e0 = local_2d0;
      if (local_668 == local_658) {
        uStack_2c8 = uStack_650;
      }
      else {
        local_2e0 = local_668;
      }
      local_2d8 = local_660;
      local_660 = 0;
      local_658[0] = 0;
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_668 = local_658;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_2c0,(function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_298 = local_288;
      local_290 = 0;
      local_288[0] = 0;
      local_278 = 0;
      if (local_2a0 == '\x01') {
        std::__cxx11::string::assign((char *)&local_298);
      }
      local_230 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_688,"tracker_decl",&local_6ca);
      local_228 = local_218;
      if (local_688 == local_678) {
        uStack_210 = uStack_670;
      }
      else {
        local_228 = local_688;
      }
      local_220 = local_680;
      local_680 = 0;
      local_678[0] = 0;
      t_1.storage_.callback_buffer_[8] = '\0';
      t_1.storage_.callback_buffer_[9] = '\0';
      t_1.storage_.callback_buffer_[10] = '\0';
      t_1.storage_.callback_buffer_[0xb] = '\0';
      t_1.storage_.callback_buffer_[0xc] = '\0';
      t_1.storage_.callback_buffer_[0xd] = '\0';
      t_1.storage_.callback_buffer_[0xe] = '\0';
      t_1.storage_.callback_buffer_[0xf] = '\0';
      t_1.storage_.is_callback_engaged_ = false;
      t_1.storage_._1_7_ = 0;
      t_1.storage_.callback_buffer_[0] = '\0';
      t_1.storage_.callback_buffer_[1] = '\0';
      t_1.storage_.callback_buffer_[2] = '\0';
      t_1.storage_.callback_buffer_[3] = '\0';
      t_1.storage_.callback_buffer_[4] = '\0';
      t_1.storage_.callback_buffer_[5] = '\0';
      t_1.storage_.callback_buffer_[6] = '\0';
      t_1.storage_.callback_buffer_[7] = '\0';
      local_688 = local_678;
      t_1.storage_._0_8_ = operator_new(0x18);
      *(MessageGenerator **)t_1.storage_._0_8_ = this;
      *(Printer ***)(t_1.storage_._0_8_ + 8) = &p_local;
      *(undefined1 *)(t_1.storage_._0_8_ + 0x10) = 0;
      t_1.storage_.callback_buffer_._8_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_208,(function<bool_()> *)&t_1);
      std::_Function_base::~_Function_base((_Function_base *)&t_1);
      local_1e0 = local_1d0;
      local_1d8 = 0;
      local_1d0[0] = 0;
      local_1c0 = 0;
      if (local_1e8 == '\x01') {
        std::__cxx11::string::assign((char *)&local_1e0);
      }
      local_178 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar1,&v_1,5,0x9e,
                 "\n        $annotate_accessor_definition$;\n        $get_metadata$;\n        $post_loop_handler$;\n        $message_set_definition$;\n        $tracker_decl$;\n      "
                );
      lVar3 = 0x2e0;
      do {
        io::Printer::Sub::~Sub((Sub *)(v_1.storage_.callback_buffer_ + lVar3 + -8));
        lVar3 = lVar3 + -0xb8;
      } while (lVar3 != -0xb8);
      std::__cxx11::string::~string((string *)&local_688);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_648);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_608);
    }
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&t);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&v);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassMethods(io::Printer* p) {
  if (!ShouldGenerateClass(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));

  if (IsMapEntryMessage(descriptor_)) {
    p->Emit({{"annotate_accessors",
              [&] {
                if (!options_.annotate_accessor) return;
                for (auto f : FieldRange(descriptor_)) {
                  p->Emit({{"field", FieldName(f)}},
                          R"cc(
                            volatile bool $classname$::$field$_AccessedNoStrip;
                          )cc");
                }
              }},
             {"verify",
              [&] {
                // Delegates generating verify function as only a subset of map
                // entry messages need it; i.e. UTF8 string key/value or message
                // type value.
                GenerateVerify(p);
              }},
             {"class_data", [&] { GenerateClassData(p); }}},
            R"cc(
#if defined(PROTOBUF_CUSTOM_VTABLE)
              $classname$::$classname$() : SuperType(_class_data_.base()) {}
              $classname$::$classname$(::$proto_ns$::Arena* arena)
                  : SuperType(arena, _class_data_.base()) {}
#else   // PROTOBUF_CUSTOM_VTABLE
              $classname$::$classname$() : SuperType() {}
              $classname$::$classname$(::$proto_ns$::Arena* arena) : SuperType(arena) {}
#endif  // PROTOBUF_CUSTOM_VTABLE
              $annotate_accessors$;
              $verify$;
              $class_data$;
            )cc");
    parse_function_generator_->GenerateDataDefinitions(p);
    return;
  }
  if (IsAnyMessage(descriptor_)) {
    p->Emit({{"any_field_descriptor",
              [&] {
                if (!HasDescriptorMethods(descriptor_->file(), options_)) {
                  return;
                }
                p->Emit(
                    R"cc(
                      bool $classname$::GetAnyFieldDescriptors(
                          const ::$proto_ns$::Message& message,
                          const ::$proto_ns$::FieldDescriptor** type_url_field,
                          const ::$proto_ns$::FieldDescriptor** value_field) {
                        return ::_pbi::GetAnyFieldDescriptors(message, type_url_field, value_field);
                      }
                    )cc");
              }}},
            R"cc(
              $any_field_descriptor$;
              bool $classname$::ParseAnyTypeUrl(::absl::string_view type_url,
                                                std::string* full_type_name) {
                return ::_pbi::ParseAnyTypeUrl(type_url, full_type_name);
              }
            )cc");
  }
  p->Emit(
      {{"has_bit",
        [&] {
          if (has_bit_indices_.empty()) return;
          p->Emit(
              R"cc(
                using HasBits =
                    decltype(std::declval<$classname$>().$has_bits$);
                static constexpr ::int32_t kHasBitsOffset =
                    8 * PROTOBUF_FIELD_OFFSET($classname$, _impl_._has_bits_);
              )cc");
        }},
       {"oneof",
        [&] {
          if (descriptor_->real_oneof_decl_count() == 0) return;
          p->Emit(
              R"cc(
                static constexpr ::int32_t kOneofCaseOffset =
                    PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$);
              )cc");
        }},
       {"required",
        [&] {
          if (num_required_fields_ == 0) return;
          const std::vector<uint32_t> masks_for_has_bits =
              RequiredFieldsBitMask();
          p->Emit(
              {{"check_bit_mask", ConditionalToCheckBitmasks(
                                      masks_for_has_bits, false, "has_bits")}},
              R"cc(
                static bool MissingRequiredFields(const HasBits& has_bits) {
                  return $check_bit_mask$;
                }
              )cc");
        }}},
      R"cc(
        class $classname$::_Internal {
         public:
          $has_bit$;
          $oneof$;
          $required$;
        };
      )cc");
  p->Emit("\n");

  // Generate non-inline field definitions.
  for (auto field : FieldRange(descriptor_)) {
    auto v = p->WithVars(FieldVars(field, options_));
    auto t = p->WithVars(MakeTrackerCalls(field, options_));
    field_generators_.get(field).GenerateNonInlineAccessorDefinitions(p);
    if (IsCrossFileMaybeMap(field)) {
      GenerateFieldClear(field, false, p);
    }
  }

  GenerateStructors(p);
  p->Emit("\n");

  if (descriptor_->real_oneof_decl_count() > 0) {
    GenerateOneofClear(p);
    p->Emit("\n");
  }

  GenerateClassData(p);
  parse_function_generator_->GenerateDataDefinitions(p);

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(p);
    p->Emit("\n");

    GenerateSerializeWithCachedSizesToArray(p);
    p->Emit("\n");

    GenerateByteSize(p);
    p->Emit("\n");

    GenerateClassSpecificMergeImpl(p);
    p->Emit("\n");

    GenerateCopyFrom(p);
    p->Emit("\n");

    GenerateIsInitialized(p);
    p->Emit("\n");
  }

  if (ShouldSplit(descriptor_, options_)) {
    p->Emit({{"split_default",
              DefaultInstanceName(descriptor_, options_, /*split=*/true)},
             {"default",
              DefaultInstanceName(descriptor_, options_, /*split=*/false)}},
            R"cc(
              void $classname$::PrepareSplitMessageForWrite() {
                if (PROTOBUF_PREDICT_TRUE(IsSplitMessageDefault())) {
                  void* chunk = $pbi$::CreateSplitMessageGeneric(
                      GetArena(), &$split_default$, sizeof(Impl_::Split), this,
                      &$default$);
                  $split$ = reinterpret_cast<Impl_::Split*>(chunk);
                }
              }
            )cc");
  }

  GenerateVerify(p);

  GenerateSwap(p);
  p->Emit("\n");

  p->Emit(
      {{"annotate_accessor_definition",
        [&] {
          if (!options_.annotate_accessor) return;
          for (auto f : FieldRange(descriptor_)) {
            p->Emit({{"field", FieldName(f)}},
                    R"cc(
                      volatile bool $classname$::$field$_AccessedNoStrip;
                    )cc");
          }
        }},
       {"get_metadata",
        [&] {
          if (!HasDescriptorMethods(descriptor_->file(), options_)) return;
          // Same as the base class, but it avoids virtual dispatch.
          p->Emit(R"cc(
            ::$proto_ns$::Metadata $classname$::GetMetadata() const {
              return $superclass$::GetMetadataImpl(GetClassData()->full());
            }
          )cc");
        }},
       {"post_loop_handler",
        [&] {
          if (!NeedsPostLoopHandler(descriptor_, options_)) return;
          p->Emit({{"required",
                    [&] {
                    }}},
                  R"cc(
                    const char* $classname$::PostLoopHandler(
                        MessageLite* msg, const char* ptr,
                        ::_pbi::ParseContext* ctx) {
                      $classname$* _this = static_cast<$classname$*>(msg);
                      $annotate_deserialize$;
                      $required$;
                      return ptr;
                    }
                  )cc");
        }},
       {"message_set_definition",
        [&] {
        }},
       {"tracker_decl",
        [&] {
          if (!HasTracker(descriptor_, options_)) return;
          p->Emit(R"cc(
            ::$proto_ns$::AccessListener<$classtype$> $classname$::$tracker$(
                &FullMessageName);
          )cc");
        }}},
      R"cc(
        $annotate_accessor_definition$;
        $get_metadata$;
        $post_loop_handler$;
        $message_set_definition$;
        $tracker_decl$;
      )cc");
}